

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  uint key_00;
  int iVar2;
  MRef MVar3;
  cTValue *pcVar4;
  
  dVar1 = key->n;
  if ((long)dVar1 >> 0x2f == 0xfffffffffffffffb) {
    pcVar4 = (cTValue *)
             ((ulong)(t->hmask & *(uint *)(((ulong)dVar1 & 0x7fffffffffff) + 0xc)) * 0x18 +
             (t->node).ptr64);
    do {
      if ((pcVar4[1].u64 & 0x7fffffffffff) == ((ulong)dVar1 & 0x7fffffffffff) &&
          (pcVar4[1].u64 & 0xffff800000000000) == 0xfffd800000000000) {
        return pcVar4;
      }
      pcVar4 = (cTValue *)pcVar4[2].u64;
    } while (pcVar4 != (cTValue *)0x0);
  }
  else {
    if ((ulong)((long)dVar1 >> 0x2f) < 0xfffffffffffffff2) {
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1))) {
        key_00 = (uint)dVar1;
        if (key_00 < t->asize) {
          pcVar4 = (cTValue *)((long)(int)key_00 * 8 + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,key_00);
        }
        if (pcVar4 != (cTValue *)0x0) {
          return pcVar4;
        }
        goto LAB_00129182;
      }
    }
    else if (dVar1 == -NAN) goto LAB_00129182;
    MVar3.ptr64 = (uint64_t)hashkey(t,key);
    do {
      iVar2 = lj_obj_equal((cTValue *)(MVar3.ptr64 + 8),key);
      if (iVar2 != 0) {
        return (cTValue *)MVar3.ptr64;
      }
      MVar3.ptr64 = ((cTValue *)(MVar3.ptr64 + 0x10))->u64;
    } while (MVar3.ptr64 != 0);
  }
LAB_00129182:
  return (cTValue *)((L->glref).ptr64 + 0xf8);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}